

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O2

Aig_Obj_t * createConstrained0LiveConeWithDSC(Aig_Man_t *pNewAig,Vec_Ptr_t *signalList)

{
  ulong uVar1;
  ulong uVar2;
  void *pvVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  int i;
  int i_00;
  
  i = signalList->nSize + -1;
  pAVar5 = pNewAig->pConst1;
  pvVar3 = Vec_PtrEntry(signalList,i);
  uVar1 = *(ulong *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x28);
  i_00 = 0;
  if (i < 1) {
    i = i_00;
  }
  while( true ) {
    if (i == i_00) {
      pAVar5 = Aig_Or(pNewAig,(Aig_Obj_t *)((ulong)pAVar5 ^ 1),
                      (Aig_Obj_t *)((uint)pvVar3 & 1 ^ uVar1));
      return pAVar5;
    }
    pvVar4 = Vec_PtrEntry(signalList,i_00);
    uVar2 = *(ulong *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x28);
    if (uVar2 == 0) break;
    pAVar5 = Aig_And(pNewAig,pAVar5,(Aig_Obj_t *)((uint)pvVar4 & 1 ^ uVar2));
    i_00 = i_00 + 1;
  }
  __assert_fail("Aig_Regular(pObj)->pData",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                ,0xe2,"Aig_Obj_t *createConstrained0LiveConeWithDSC(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Aig_Obj_t *createConstrained0LiveConeWithDSC( Aig_Man_t *pNewAig, Vec_Ptr_t *signalList )
{
	Aig_Obj_t *pConsequent, *pConsequentCopy, *pAntecedent, *p0LiveCone, *pObj;
	int i, numSigAntecedent;
	
	numSigAntecedent = Vec_PtrSize( signalList ) - 1;

	pAntecedent = Aig_ManConst1( pNewAig );
	pConsequent = (Aig_Obj_t *)Vec_PtrEntry( signalList, numSigAntecedent );
	pConsequentCopy = Aig_NotCond( (Aig_Obj_t *)(Aig_Regular(pConsequent)->pData), Aig_IsComplement( pConsequent ) );

	for(i=0; i<numSigAntecedent; i++ )
	{
		pObj = (Aig_Obj_t *)Vec_PtrEntry( signalList, i );
		assert( Aig_Regular(pObj)->pData );
		pAntecedent = Aig_And( pNewAig, pAntecedent, Aig_NotCond((Aig_Obj_t *)(Aig_Regular(pObj)->pData), Aig_IsComplement(pObj)) );
	}

	p0LiveCone = Aig_Or( pNewAig, Aig_Not(pAntecedent), pConsequentCopy );

	return p0LiveCone;
}